

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::flush_variable_declaration(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *var_00;
  SPIRType *type;
  undefined1 local_b0 [64];
  spirv_cross local_70 [48];
  string local_40 [8];
  string initializer;
  SPIRVariable *var;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  var_00 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if ((var_00 != (SPIRVariable *)0x0) && ((var_00->deferred_declaration & 1U) != 0)) {
    ::std::__cxx11::string::string(local_40);
    if (((((this->options).force_zero_initialized_variables & 1U) != 0) &&
        (((var_00->storage == StorageClassFunction || (var_00->storage == StorageClassGeneric)) ||
         (var_00->storage == StorageClassPrivate)))) &&
       (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_00->initializer), uVar2 == 0)
       ) {
      type = Compiler::get_variable_data_type(&this->super_Compiler,var_00);
      bVar1 = type_can_zero_initialize(this,type);
      if (bVar1) {
        uVar2 = Compiler::get_variable_data_type_id(&this->super_Compiler,var_00);
        (*(this->super_Compiler)._vptr_Compiler[0x39])(local_b0 + 0x20,this,(ulong)uVar2);
        join<char_const(&)[4],std::__cxx11::string>
                  (local_70,(char (*) [4])0x601511,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b0 + 0x20));
        ::std::__cxx11::string::operator=(local_40,(string *)local_70);
        ::std::__cxx11::string::~string((string *)local_70);
        ::std::__cxx11::string::~string((string *)(local_b0 + 0x20));
      }
    }
    variable_decl_function_local_abi_cxx11_((CompilerGLSL *)local_b0,(SPIRVariable *)this);
    statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5e9b70);
    ::std::__cxx11::string::~string((string *)local_b0);
    var_00->deferred_declaration = false;
    ::std::__cxx11::string::~string(local_40);
  }
  if (var_00 != (SPIRVariable *)0x0) {
    emit_variable_temporary_copies(this,var_00);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_variable_declaration(uint32_t id)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->deferred_declaration)
	{
		string initializer;
		if (options.force_zero_initialized_variables &&
		    (var->storage == StorageClassFunction || var->storage == StorageClassGeneric ||
		     var->storage == StorageClassPrivate) &&
		    !var->initializer && type_can_zero_initialize(get_variable_data_type(*var)))
		{
			initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(*var)));
		}

		statement(variable_decl_function_local(*var), initializer, ";");
		var->deferred_declaration = false;
	}
	if (var)
	{
		emit_variable_temporary_copies(*var);
	}
}